

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inheritance.hpp
# Opt level: O0

void boost::python::objects::register_conversion<NeuralConsumer_python,NeuralConsumer>
               (bool is_downcast,NeuralConsumer_python *param_2,NeuralConsumer *param_3)

{
  type_info tVar1;
  type_info tVar2;
  byte in_DIL;
  
  tVar1 = type_id<NeuralConsumer_python>();
  tVar2 = type_id<NeuralConsumer>();
  add_cast(tVar1,tVar2,implicit_cast_generator<NeuralConsumer_python,_NeuralConsumer>::execute,
           (bool)(in_DIL & 1));
  return;
}

Assistant:

inline void register_conversion(
    bool is_downcast = ::boost::is_base_and_derived<Source,Target>::value
    // These parameters shouldn't be used; they're an MSVC bug workaround
    , Source* = 0, Target* = 0)
{
    typedef typename cast_generator<Source,Target>::type generator;

    add_cast(
        python::type_id<Source>()
      , python::type_id<Target>()
      , &generator::execute
      , is_downcast
    );
}